

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O1

BinsSelectExpr * __thiscall
slang::ast::BinaryBinsSelectExpr::fromSyntax
          (BinaryBinsSelectExpr *this,BinaryBinsSelectExprSyntax *syntax,ASTContext *context)

{
  BumpAllocator *this_00;
  undefined4 in_EAX;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BinaryBinsSelectExpr *pBVar3;
  socklen_t __len;
  Op op;
  undefined8 uStack_28;
  
  this_00 = (BumpAllocator *)
            **(undefined8 **)&(syntax->super_BinsSelectExpressionSyntax).super_SyntaxNode;
  uStack_28._0_4_ = in_EAX;
  iVar1 = BinsSelectExpr::bind((int)this->right,(sockaddr *)syntax,(socklen_t)context);
  iVar2 = BinsSelectExpr::bind((int)this[1].super_BinsSelectExpr.syntax,(sockaddr *)syntax,__len);
  uStack_28 = (ulong)CONCAT14((short)this->op != 0x5a,(undefined4)uStack_28);
  pBVar3 = BumpAllocator::
           emplace<slang::ast::BinaryBinsSelectExpr,slang::ast::BinsSelectExpr_const&,slang::ast::BinsSelectExpr_const&,slang::ast::BinaryBinsSelectExpr::Op&>
                     (this_00,(BinsSelectExpr *)CONCAT44(extraout_var,iVar1),
                      (BinsSelectExpr *)CONCAT44(extraout_var_00,iVar2),(Op *)((long)&uStack_28 + 4)
                     );
  return &pBVar3->super_BinsSelectExpr;
}

Assistant:

BinsSelectExpr& BinaryBinsSelectExpr::fromSyntax(const BinaryBinsSelectExprSyntax& syntax,
                                                 const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& left = bind(*syntax.left, context);
    auto& right = bind(*syntax.right, context);
    Op op = syntax.op.kind == TokenKind::DoubleAnd ? And : Or;
    return *comp.emplace<BinaryBinsSelectExpr>(left, right, op);
}